

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

UINT8 device_start_ym2413_emu(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  EOPLL *opll;
  uint32_t local_2c;
  uint32_t rate;
  EOPLL *chip;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  local_2c = cfg->clock / 0x48;
  if ((cfg->srMode == '\x01') || ((cfg->srMode == '\x02' && (local_2c < cfg->smplRate)))) {
    local_2c = cfg->smplRate;
  }
  opll = EOPLL_new(cfg->clock,local_2c);
  if (opll == (EOPLL *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    EOPLL_setChipType(opll,cfg->flags & 1);
    opll->_devData = (DEV_DATA)opll;
    INIT_DEVINF(retDevInf,&opll->_devData,local_2c,&devDef_YM2413_Emu);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_ym2413_emu(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	EOPLL* chip;
	uint32_t rate;
	
	rate = cfg->clock / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = EOPLL_new(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	EOPLL_setChipType(chip, cfg->flags & 0x01);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, rate, &devDef_YM2413_Emu);
	return 0x00;
}